

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O3

p2sc_iofile_t * p2sc_open_iofile(char *name,char *mode)

{
  char cVar1;
  int iVar2;
  p2sc_iofile_t *ppVar3;
  char *pcVar4;
  GIOChannel *pGVar5;
  undefined8 uVar6;
  int severity;
  char *fmt;
  GError *err;
  
  err = (GError *)0x0;
  ppVar3 = (p2sc_iofile_t *)g_malloc(0x18);
  if (*name == '-') {
    cVar1 = *mode;
    if ((cVar1 == 'a') || (cVar1 == 'w')) {
      pcVar4 = (char *)g_strdup("stdout");
      ppVar3->name = pcVar4;
      uVar6 = 1;
    }
    else {
      if (cVar1 != 'r') {
        fmt = "Unknown mode %s on %s";
        iVar2 = 0x6f;
        severity = 4000;
        goto LAB_0010b5fa;
      }
      pcVar4 = (char *)g_strdup("stdin");
      ppVar3->name = pcVar4;
      uVar6 = 0;
    }
    pGVar5 = (GIOChannel *)g_io_channel_unix_new(uVar6);
  }
  else {
    pcVar4 = (char *)g_strdup(name);
    ppVar3->name = pcVar4;
    pGVar5 = (GIOChannel *)g_io_channel_new_file(pcVar4,mode,&err);
  }
  ppVar3->io = pGVar5;
  if (pGVar5 == (GIOChannel *)0x0) {
    if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
      fmt = "%s: failed to open IO channel: unknown reason";
      iVar2 = 0x8d;
    }
    else {
      fmt = "%s: failed to open IO channel: %s";
      iVar2 = 0x89;
    }
  }
  else {
    iVar2 = g_io_channel_set_encoding(pGVar5,0,&err);
    if ((err == (GError *)0x0) || (err->message == (gchar *)0x0)) {
      if (iVar2 == 1) {
        g_io_channel_set_close_on_unref(pGVar5,1);
        ppVar3->lineno = 0;
        return ppVar3;
      }
      fmt = "%s: failed to change encoding of IO channel with status %d";
      iVar2 = 0x81;
    }
    else {
      fmt = "%s: failed to change encoding of IO channel: %s";
      iVar2 = 0x79;
    }
  }
  severity = 0x1068;
  mode = pcVar4;
LAB_0010b5fa:
  _p2sc_msg("p2sc_open_iofile",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar2,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",severity,fmt,mode);
  exit(1);
}

Assistant:

p2sc_iofile_t *p2sc_open_iofile(const char *name, const char *mode) {
    GError *err = NULL;
    p2sc_iofile_t *f = (p2sc_iofile_t *) g_malloc(sizeof *f);

    if (name[0] == '-') {
        if (mode[0] == 'r') {
            f->name = g_strdup("stdin");
            f->io = g_io_channel_unix_new(STDIN_FILENO);
        } else if (mode[0] == 'w' || mode[0] == 'a') {
            f->name = g_strdup("stdout");
            f->io = g_io_channel_unix_new(STDOUT_FILENO);
        } else
            P2SC_Msg(LVL_FATAL, "Unknown mode %s on %s", mode, name);
    } else {
        f->name = g_strdup(name);
        f->io = g_io_channel_new_file(f->name, mode, &err);
    }

    if (f->io) {
        GIOStatus status = g_io_channel_set_encoding(f->io, NULL, &err);
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: failed to change encoding of IO channel: %s",
                     f->name, err->message);
            g_error_free(err);
            /* not reached */
            p2sc_free_iofile(f);
            return NULL;
        } else if (status != G_IO_STATUS_NORMAL) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM,
                     "%s: failed to change encoding of IO channel with status %d", f->name,
                     (int) status);
            /* not reached */
            p2sc_free_iofile(f);
            return NULL;
        }
    } else {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "%s: failed to open IO channel: %s",
                     f->name, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL_FILESYSTEM,
                     "%s: failed to open IO channel: unknown reason", f->name);
        /* not reached */
        p2sc_free_iofile(f);
        return NULL;
    }

    g_io_channel_set_close_on_unref(f->io, TRUE);
    f->lineno = 0;

    return f;
}